

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

void tcg_out_cmov(TCGContext_conflict9 *s,TCGCond cond,int rexw,TCGReg dest,TCGReg v1)

{
  TCGReg v1_local;
  TCGReg dest_local;
  int rexw_local;
  TCGCond cond_local;
  TCGContext_conflict9 *s_local;
  
  tcg_out_modrm(s,""[cond] | 0x140 | rexw,dest,v1);
  return;
}

Assistant:

static void tcg_out_cmov(TCGContext *s, TCGCond cond, int rexw,
                         TCGReg dest, TCGReg v1)
{
    if (have_cmov) {
        tcg_out_modrm(s, OPC_CMOVCC | tcg_cond_to_jcc[cond] | rexw, dest, v1);
    } else {
        TCGLabel *over = gen_new_label(s);
        tcg_out_jxx(s, tcg_cond_to_jcc[tcg_invert_cond(cond)], over, 1);
        tcg_out_mov(s, TCG_TYPE_I32, dest, v1);
        tcg_out_label(s, over, s->code_ptr);
    }
}